

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O2

void beltWBLStepD2(void *buf1,void *buf2,size_t count,void *state)

{
  ulong *src;
  void *src_00;
  ulong uVar1;
  long lVar2;
  
  src = (ulong *)((long)state + 0x40);
  src_00 = (void *)((long)buf1 + (count - 0x20));
  uVar1 = count + 0xf >> 3 & 0xfffffffffffffffe;
  while (*src = uVar1, uVar1 != 0) {
    *(undefined8 *)((long)state + 0x20) = *buf2;
    *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf2 + 8);
    memCopy(buf2,src_00,0x10);
    memMove((void *)((long)buf1 + 0x10),buf1,count - 0x20);
    *(undefined8 *)buf1 = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)buf1 + 8) = *(undefined8 *)((long)state + 0x28);
    beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
    memXor2((octet *)((long)state + 0x20),src,8);
    *(ulong *)buf2 = *buf2 ^ *(ulong *)((long)state + 0x20);
    *(ulong *)((long)buf2 + 8) = *(ulong *)((long)buf2 + 8) ^ *(ulong *)((long)state + 0x28);
    for (lVar2 = 0; lVar2 + 0x30U < count; lVar2 = lVar2 + 0x10) {
      *(ulong *)buf1 = *buf1 ^ *(ulong *)((long)buf1 + lVar2 + 0x10);
      *(ulong *)((long)buf1 + 8) =
           *(ulong *)((long)buf1 + 8) ^ *(ulong *)((long)buf1 + lVar2 + 0x18);
    }
    if (lVar2 + 0x20U < count) {
      memXor2(buf1,(void *)((long)buf1 + lVar2 + 0x10),(count - 0x20) - lVar2);
      memXor2((void *)((long)src_00 - lVar2),buf2,lVar2 + (0x30 - count));
    }
    uVar1 = *src - 1;
  }
  return;
}

Assistant:

void beltWBLStepD2(void* buf1, void* buf2, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	// pre
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint3(buf1, count - 16, buf2, 16, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, buf2);
		// r <- ShHi^128(r)
		memCopy(buf2, (octet*)buf1 + count - 32, 16);
		memMove((octet*)buf1 + 16, buf1, count - 32);
		// r1 <- block
		beltBlockCopy(buf1, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2(buf2, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 32 < count; i += 16)
			beltBlockXor2(buf1, (octet*)buf1 + i);
		ASSERT(i + 16 <= count && i + 32 >= count);
		if (i + 16 < count)
		{
			memXor2(buf1, (octet*)buf1 + i, count - 16 - i);
			memXor2((octet*)buf1 + count - 16 - i, buf2, 32 + i - count);
		}
	}
}